

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

int duckdb::DecimalToString::DecimalLength<long>(long value,uint8_t width,uint8_t scale)

{
  int iVar1;
  int iVar2;
  undefined3 in_register_00000011;
  int iVar3;
  
  if (CONCAT31(in_register_00000011,scale) != 0) {
    iVar3 = ((uint)scale - (int)(value >> 0x3f)) + (uint)(scale < width) + 1;
    iVar2 = NumericHelper::SignedLength<long,unsigned_long>(value);
    iVar1 = iVar2 + 1;
    if (iVar2 + 1 < iVar3) {
      iVar1 = iVar3;
    }
    return iVar1;
  }
  iVar1 = NumericHelper::SignedLength<long,unsigned_long>(value);
  return iVar1;
}

Assistant:

static int DecimalLength(SIGNED value, uint8_t width, uint8_t scale) {
		using UNSIGNED = typename MakeUnsigned<SIGNED>::type;
		if (scale == 0) {
			// scale is 0: regular number
			return NumericHelper::SignedLength<SIGNED, UNSIGNED>(value);
		}
		// length is max of either:
		// scale + 2 OR
		// integer length + 1
		// scale + 2 happens when the number is in the range of (-1, 1)
		// in that case we print "0.XXX", which is the scale, plus "0." (2 chars)
		// integer length + 1 happens when the number is outside of that range
		// in that case we print the integer number, but with one extra character ('.')
		auto extra_characters = width > scale ? 2 : 1;
		return MaxValue(scale + extra_characters + (value < 0 ? 1 : 0),
		                NumericHelper::SignedLength<SIGNED, UNSIGNED>(value) + 1);
	}